

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReader.cpp
# Opt level: O2

StepStatus __thiscall
adios2::core::engine::SscReader::BeginStep(SscReader *this,StepMode stepMode,float timeoutSeconds)

{
  element_type *peVar1;
  StepStatus SVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined8 uVar5;
  allocator local_a7;
  allocator local_a6;
  allocator local_a5;
  float local_a4;
  ScopedTimer __var260;
  string local_98;
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  
  local_a4 = timeoutSeconds;
  if (BeginStep(adios2::StepMode,float)::__var60 == '\0') {
    iVar3 = __cxa_guard_acquire(&BeginStep(adios2::StepMode,float)::__var60);
    if (iVar3 != 0) {
      uVar5 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/ssc/SscReader.cpp"
                                  ,
                                  "virtual StepStatus adios2::core::engine::SscReader::BeginStep(StepMode, const float)"
                                  ,0x3c);
      BeginStep::__var60 = (void *)ps_timer_create_(uVar5);
      __cxa_guard_release(&BeginStep(adios2::StepMode,float)::__var60);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&__var260,BeginStep::__var60);
  peVar1 = (this->m_EngineInstance).
           super___shared_ptr<adios2::core::engine::ssc::SscReaderBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  SVar2 = (*peVar1->_vptr_SscReaderBase[2])(local_a4,peVar1,stepMode,(ulong)(byte)this->field_0x83);
  std::__cxx11::string::string(local_38,"Engine",&local_a5);
  std::__cxx11::string::string(local_58,"SscReader",&local_a6);
  std::__cxx11::string::string(local_78,"BeginStep",&local_a7);
  iVar3 = (*((this->m_EngineInstance).
             super___shared_ptr<adios2::core::engine::ssc::SscReaderBase,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_SscReaderBase[3])();
  std::__cxx11::to_string(&local_98,CONCAT44(extraout_var,iVar3));
  iVar3 = 0;
  if (9 < this->m_Verbosity) {
    iVar3 = adios2::helper::Comm::Rank();
  }
  iVar4 = adios2::helper::Comm::Rank();
  adios2::helper::Log(local_38,local_58,local_78,(string *)&local_98,iVar3,iVar4,5,this->m_Verbosity
                      ,INFO);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var260);
  return SVar2;
}

Assistant:

StepStatus SscReader::BeginStep(StepMode stepMode, const float timeoutSeconds)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();

    auto ret = m_EngineInstance->BeginStep(stepMode, timeoutSeconds, m_ReaderSelectionsLocked);

    helper::Log("Engine", "SscReader", "BeginStep", std::to_string(CurrentStep()),
                m_Verbosity >= 10 ? m_Comm.Rank() : 0, m_Comm.Rank(), 5, m_Verbosity,
                helper::LogMode::INFO);

    return ret;
}